

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O0

int __thiscall SplayTree::remove(SplayTree *this,char *__filename)

{
  Node *in_RDX;
  int value;
  Node *temp;
  Node *root_local;
  int value_local;
  SplayTree *this_local;
  
  value = (int)__filename;
  if (in_RDX == (Node *)0x0) {
    this_local = (SplayTree *)0x0;
  }
  else {
    this_local = (SplayTree *)splay(this,value,in_RDX);
    if (value == ((Node *)this_local)->value) {
      if (((Node *)this_local)->leftChild == (Node *)0x0) {
        temp = ((Node *)this_local)->rightChild;
      }
      else {
        temp = splay(this,value,((Node *)this_local)->leftChild);
        temp->rightChild = ((Node *)this_local)->rightChild;
      }
      free(this_local);
      this_local = (SplayTree *)temp;
    }
  }
  return (int)this_local;
}

Assistant:

SplayTree::Node *SplayTree::remove(int value, Node *root) {
    Node *temp;
    if (!root) {
        return nullptr;
    }
    root = splay(value, root);
    if (value != root->value) { // No such node in splay tree
        return root;
    } else {
        if (!root->leftChild) {
            temp = root;
            root = root->rightChild;
        } else {
            temp = root;
            /*Note: Since key == root->key, so after Splay(key, root->lChild),
              the tree we get will have no right child tree. (key > any key in
              root->lChild)*/
            root = splay(value, root->leftChild);
            root->rightChild = temp->rightChild;
        }
        free(temp);
        return root;
    }
}